

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

bool idx2::ToInt(stref *Str,int *Result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  power<int,_10> local_59;
  int local_58;
  int local_54;
  int V;
  int I;
  int Start;
  int Mult;
  stref *StrR;
  int *Result_local;
  stref *Str_local;
  stref *local_28;
  undefined4 local_1c;
  stref *local_18;
  stref *local_10;
  
  if (((Str->field_0).Ptr == (str)0x0) || (Str->Size < 1)) {
    Str_local._3_1_ = false;
  }
  else {
    I = 1;
    V = 0;
    local_1c = 0;
    _Start = Str;
    StrR = (stref *)Result;
    Result_local = (int *)Str;
    local_18 = Str;
    local_10 = Str;
    if (Str->Size < 1) {
      __assert_fail("Idx < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                    ,0x9b,"char &idx2::stref::operator[](int) const");
    }
    bVar4 = *(Str->field_0).Ptr == '-';
    if (bVar4) {
      I = -1;
    }
    V = (int)bVar4;
    *Result = 0;
    for (local_54 = 0; iVar1 = I, local_54 < Result_local[2] - V; local_54 = local_54 + 1) {
      Str_local._4_4_ = (_Start->Size - local_54) + -1;
      local_28 = _Start;
      if (_Start->Size <= Str_local._4_4_) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      iVar2 = (_Start->field_0).Ptr[Str_local._4_4_] + -0x30;
      if ((iVar2 < 0) || (9 < iVar2)) {
        return false;
      }
      local_58 = iVar2;
      iVar3 = power<int,_10>::operator[](&local_59,local_54);
      *(int *)&StrR->field_0 = iVar1 * iVar2 * iVar3 + *(int *)&StrR->field_0;
    }
    Str_local._3_1_ = true;
  }
  return Str_local._3_1_;
}

Assistant:

bool
ToInt(const stref& Str, int* Result)
{
  stref& StrR = const_cast<stref&>(Str);
  if (!StrR || StrR.Size <= 0)
    return false;

  int Mult = 1, Start = 0;
  if (StrR[0] == '-')
  {
    Mult = -1;
    Start = 1;
  }
  *Result = 0;
  for (int I = 0; I < Str.Size - Start; ++I)
  {
    int V = StrR[StrR.Size - I - 1] - '0';
    if (V >= 0 && V < 10)
      *Result += Mult * (V * power<int, 10>()[I]);
    else
      return false;
  }
  return true;
}